

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

void __thiscall expr_tree::mulSimplifs(expr_tree *this,expr_node *node)

{
  expr_node **ppeVar1;
  bool bVar2;
  expr_node *tmp;
  expr_node *peVar3;
  expr_node *this_00;
  
  ppeVar1 = &node->left;
  bVar2 = IsZero(node->left);
  if ((!bVar2) && (bVar2 = IsZero(node->right), !bVar2)) {
    bVar2 = IsOne(node->left);
    peVar3 = node->right;
    if (bVar2) {
      this_00 = *ppeVar1;
    }
    else {
      bVar2 = IsOne(peVar3);
      if (!bVar2) {
        return;
      }
      peVar3 = node->left;
      this_00 = node->right;
    }
    if (this_00 != (expr_node *)0x0) {
      expr_node::~expr_node(this_00);
    }
    operator_delete(this_00,0x28);
    node->type = peVar3->type;
    node->value = peVar3->value;
    Link(node,peVar3->left,peVar3->right);
    peVar3->left = (expr_node *)0x0;
    peVar3->right = (expr_node *)0x0;
    expr_node::~expr_node(peVar3);
    operator_delete(peVar3,0x28);
    return;
  }
  peVar3 = *ppeVar1;
  if (peVar3 != (expr_node *)0x0) {
    expr_node::~expr_node(peVar3);
  }
  operator_delete(peVar3,0x28);
  peVar3 = node->right;
  if (peVar3 != (expr_node *)0x0) {
    expr_node::~expr_node(peVar3);
  }
  operator_delete(peVar3,0x28);
  *ppeVar1 = (expr_node *)0x0;
  node->right = (expr_node *)0x0;
  node->type = '\x01';
  (node->value).integer = 0;
  return;
}

Assistant:

void expr_tree::mulSimplifs(expr_node* node)
{
    
    if (IsZero(node->left) || IsZero(node->right)) {
        delete node->left;
        delete node->right;
        node->left = node->right = nullptr;
        node->type = INT;
        node->value.integer = 0;
    } else if (IsOne(node->left)) {
        expr_node* tmp = node->right;
        delete node->left;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    } else if (IsOne(node->right)) {
        expr_node* tmp = node->left;
        delete node->right;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    }
}